

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error
ft_stroke_border_get_counts
          (PVG_FT_StrokeBorder border,PVG_FT_UInt *anum_points,PVG_FT_UInt *anum_contours)

{
  bool bVar1;
  byte *pbStack_40;
  PVG_FT_Int in_contour;
  PVG_FT_Byte *tags;
  PVG_FT_Vector *point;
  PVG_FT_UInt count;
  PVG_FT_UInt num_contours;
  PVG_FT_UInt num_points;
  PVG_FT_Error error;
  PVG_FT_UInt *anum_contours_local;
  PVG_FT_UInt *anum_points_local;
  PVG_FT_StrokeBorder border_local;
  
  count = 0;
  point._4_4_ = 0;
  pbStack_40 = border->tags;
  bVar1 = false;
  for (point._0_4_ = border->num_points; (PVG_FT_UInt)point != 0;
      point._0_4_ = (PVG_FT_UInt)point - 1) {
    if ((*pbStack_40 & 4) == 0) {
      if (!bVar1) goto LAB_001354b4;
    }
    else {
      if (bVar1) goto LAB_001354b4;
      bVar1 = true;
    }
    if ((*pbStack_40 & 8) != 0) {
      bVar1 = false;
      point._4_4_ = point._4_4_ + 1;
    }
    count = count + 1;
    pbStack_40 = pbStack_40 + 1;
  }
  if (bVar1) {
LAB_001354b4:
    count = 0;
    point._4_4_ = 0;
  }
  else {
    border->valid = '\x01';
  }
  *anum_points = count;
  *anum_contours = point._4_4_;
  return 0;
}

Assistant:

static PVG_FT_Error ft_stroke_border_get_counts(PVG_FT_StrokeBorder border,
                                               PVG_FT_UInt*        anum_points,
                                               PVG_FT_UInt*        anum_contours)
{
    PVG_FT_Error error = 0;
    PVG_FT_UInt  num_points = 0;
    PVG_FT_UInt  num_contours = 0;

    PVG_FT_UInt    count = border->num_points;
    PVG_FT_Vector* point = border->points;
    PVG_FT_Byte*   tags = border->tags;
    PVG_FT_Int     in_contour = 0;

    for (; count > 0; count--, num_points++, point++, tags++) {
        if (tags[0] & PVG_FT_STROKE_TAG_BEGIN) {
            if (in_contour != 0) goto Fail;

            in_contour = 1;
        } else if (in_contour == 0)
            goto Fail;

        if (tags[0] & PVG_FT_STROKE_TAG_END) {
            in_contour = 0;
            num_contours++;
        }
    }

    if (in_contour != 0) goto Fail;

    border->valid = TRUE;

Exit:
    *anum_points = num_points;
    *anum_contours = num_contours;
    return error;

Fail:
    num_points = 0;
    num_contours = 0;
    goto Exit;
}